

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::ECConsume
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,CharCount n)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)n;
  if (this->inputLim < this->next + uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) {
LAB_00ecf497:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (n != 0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar4 = 0;
    do {
      if ((char)this->next[uVar4] < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar2) goto LAB_00ecf497;
        *puVar3 = 0;
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  this->next = this->next + uVar5;
  return;
}

Assistant:

inline void Parser<P, IsLiteral>::ECConsume(CharCount n /*= 1*/)
    {
        Assert(next + n <= inputLim);
#if DBG
        for (CharCount i = 0; i < n; i++)
            Assert(!this->IsMultiUnitChar(next[i]));
#endif
        next += n;
    }